

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

char * BuildModuleFromSource
                 (Allocator *allocator,char *modulePath,char *moduleRoot,char *code,uint codeSize,
                 char **errorPos,char *errorBuf,uint errorBufSize,int optimizationLevel,
                 ArrayView<InplaceStr> activeImports,CompilerStatistics *statistics)

{
  Lexer *this;
  uint uVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  Lexeme *pLVar9;
  Lexeme *pLVar10;
  uint uVar11;
  ByteCode *bytecode;
  ArrayView<InplaceStr> activeImports_00;
  TraceScope traceScope;
  CompilerContext ctx;
  ByteCode *local_a898;
  TraceScope local_a890;
  CompilerContext local_a880;
  
  if (BuildModuleFromSource(Allocator*,char_const*,char_const*,char_const*,unsigned_int,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
      ::token == '\0') {
    iVar6 = __cxa_guard_acquire(&BuildModuleFromSource(Allocator*,char_const*,char_const*,char_const*,unsigned_int,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
                                 ::token);
    if (iVar6 != 0) {
      BuildModuleFromSource::token = NULLC::TraceGetToken("compiler","BuildModuleFromSource");
      __cxa_guard_release(&BuildModuleFromSource(Allocator*,char_const*,char_const*,char_const*,unsigned_int,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
                           ::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_a890,BuildModuleFromSource::token);
  lVar4 = NULLC::traceContext;
  sVar7 = strlen(modulePath);
  uVar11 = (int)sVar7 + 1;
  if ((*(uint *)(lVar4 + 0x264) <= *(int *)(lVar4 + 0x260) + uVar11) ||
     (*(int *)(lVar4 + 0x270) == *(int *)(lVar4 + 0x274))) {
    NULLC::TraceDump();
  }
  if (*(uint *)(lVar4 + 0x264) <= uVar11) {
    __assert_fail("count < context.labels.max",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                  ,0x127,"void NULLC::TraceLabel(const char *)");
  }
  uVar1 = *(uint *)(lVar4 + 0x260);
  memcpy((void *)((ulong)uVar1 + *(long *)(lVar4 + 0x268)),modulePath,(ulong)uVar11);
  *(int *)(lVar4 + 0x260) = *(int *)(lVar4 + 0x260) + uVar11;
  lVar2 = *(long *)(lVar4 + 0x278);
  uVar11 = *(uint *)(lVar4 + 0x270);
  *(uint *)(lVar4 + 0x270) = uVar11 + 1;
  *(uint *)(lVar2 + (ulong)uVar11 * 8) = uVar1 * 4 + 2;
  *(undefined4 *)(lVar2 + 4 + (ulong)uVar11 * 8) = 0;
  activeImports_00._12_4_ = 0;
  activeImports_00.data = activeImports.data;
  activeImports_00.count = activeImports.count;
  CompilerContext::CompilerContext(&local_a880,allocator,optimizationLevel,activeImports_00);
  local_a880.errorBuf = errorBuf;
  local_a880.errorBufSize = errorBufSize;
  local_a880.code = code;
  local_a880.moduleRoot = moduleRoot;
  bVar5 = CompileModuleFromSource(&local_a880);
  if (bVar5) {
    local_a880.statistics.startTime = NULLCTime::clockMicro();
    local_a880.statistics.finishTime = 0;
    local_a898 = (ByteCode *)0x0;
    GetBytecode(&local_a880,(char **)&local_a898);
    uVar11 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(&local_a880.statistics,"Bytecode",uVar11);
    local_a880.statistics.startTime = NULLCTime::clockMicro();
    bytecode = local_a898;
    local_a880.statistics.finishTime = 0;
    pcVar8 = FindSource(local_a898);
    this = &local_a880.parseCtx.lexer;
    pLVar9 = Lexer::GetStreamStart(this);
    pLVar10 = Lexer::GetStreamStart(this);
    uVar11 = Lexer::GetStreamSize(this);
    if (pLVar9 != pLVar10 + uVar11) {
      do {
        pcVar3 = pLVar9->pos;
        if ((pcVar3 < code) || (code + codeSize < pcVar3)) break;
        pLVar9->pos = pcVar8 + ((long)pcVar3 - (long)code);
        pLVar9 = pLVar9 + 1;
      } while (pLVar9 != pLVar10 + uVar11);
    }
    pLVar9 = Lexer::GetStreamStart(this);
    uVar11 = Lexer::GetStreamSize(this);
    BinaryCache::PutBytecode(modulePath,(char *)bytecode,pLVar9,uVar11);
    uVar11 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(&local_a880.statistics,"BytecodeCache",uVar11);
    if (statistics != (CompilerStatistics *)0x0) {
      CompilerStatistics::Add(statistics,&local_a880.statistics);
    }
  }
  else {
    *errorPos = local_a880.errorPos;
    if (errorBufSize == 0 || errorBuf == (char *)0x0) {
      bytecode = (ByteCode *)0x0;
    }
    else {
      sVar7 = strlen(errorBuf);
      bytecode = (ByteCode *)0x0;
      NULLC::SafeSprintf(errorBuf + (sVar7 & 0xffffffff),(ulong)(errorBufSize - (int)sVar7),
                         " [in module \'%s\']",modulePath);
    }
  }
  CompilerContext::~CompilerContext(&local_a880);
  NULLC::TraceScope::~TraceScope(&local_a890);
  return (char *)bytecode;
}

Assistant:

char* BuildModuleFromSource(Allocator *allocator, const char *modulePath, const char *moduleRoot, const char *code, unsigned codeSize, const char **errorPos, char *errorBuf, unsigned errorBufSize, int optimizationLevel, ArrayView<InplaceStr> activeImports, CompilerStatistics *statistics)
{
	TRACE_SCOPE("compiler", "BuildModuleFromSource");
	TRACE_LABEL(modulePath);

	CompilerContext ctx(allocator, optimizationLevel, activeImports);

	ctx.errorBuf = errorBuf;
	ctx.errorBufSize = errorBufSize;

	ctx.code = code;
	ctx.moduleRoot = moduleRoot;

	if(!CompileModuleFromSource(ctx))
	{
		*errorPos = ctx.errorPos;

		if(errorBuf && errorBufSize)
		{
			unsigned currLen = (unsigned)strlen(errorBuf);
			NULLC::SafeSprintf(errorBuf + currLen, errorBufSize - currLen, " [in module '%s']", modulePath);
		}

		return NULL;
	}

	ctx.statistics.Start(NULLCTime::clockMicro());

	char *bytecode = NULL;
	GetBytecode(ctx, &bytecode);

	ctx.statistics.Finish("Bytecode", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	Lexer &lexer = ctx.parseCtx.lexer;

	const char *newStart = FindSource((ByteCode*)bytecode);

	// We have to fix lexeme positions to the code that is saved in bytecode
	for(Lexeme *c = lexer.GetStreamStart(), *e = lexer.GetStreamStart() + lexer.GetStreamSize(); c != e; c++)
	{
		// Exit fix up if lexemes exited scope of the current file
		if(c->pos < code || c->pos > (code + codeSize))
			break;

		c->pos = newStart + (c->pos - code);
	}

	BinaryCache::PutBytecode(modulePath, bytecode, lexer.GetStreamStart(), lexer.GetStreamSize());

	ctx.statistics.Finish("BytecodeCache", NULLCTime::clockMicro());

	if(statistics)
		statistics->Add(ctx.statistics);

	return bytecode;
}